

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntlEngineInterfaceExtensionObject.cpp
# Opt level: O0

void Js::IntlEngineInterfaceExtensionObject::deletePrototypePropertyHelper
               (ScriptContext *scriptContext,DynamicObject *intlObject,PropertyId objectPropertyId,
               PropertyId getterFunctionId)

{
  BOOL BVar1;
  DynamicObject *instance;
  Var local_58;
  Var setter;
  Var getter;
  Var resolvedOptionsValue;
  Var prototypeValue;
  Var propertyValue;
  DynamicObject *functionObj;
  DynamicObject *prototypeObject;
  PropertyId getterFunctionId_local;
  PropertyId objectPropertyId_local;
  DynamicObject *intlObject_local;
  ScriptContext *scriptContext_local;
  
  functionObj = (DynamicObject *)0x0;
  propertyValue = (Var)0x0;
  prototypeValue = (Var)0x0;
  resolvedOptionsValue = (Var)0x0;
  getter = (Var)0x0;
  setter = (Var)0x0;
  local_58 = (Var)0x0;
  prototypeObject._0_4_ = getterFunctionId;
  prototypeObject._4_4_ = objectPropertyId;
  _getterFunctionId_local = intlObject;
  intlObject_local = (DynamicObject *)scriptContext;
  BVar1 = Js::JavascriptOperators::GetProperty
                    (&intlObject->super_RecyclableObject,objectPropertyId,&prototypeValue,
                     scriptContext,(PropertyValueInfo *)0x0);
  if ((BVar1 != 0) && (BVar1 = Js::JavascriptOperators::IsObject(prototypeValue), BVar1 != 0)) {
    instance = VarTo<Js::DynamicObject>(prototypeValue);
    BVar1 = Js::JavascriptOperators::GetProperty
                      (&instance->super_RecyclableObject,0x124,&resolvedOptionsValue,
                       (ScriptContext *)intlObject_local,(PropertyValueInfo *)0x0);
    if ((BVar1 != 0) &&
       (BVar1 = Js::JavascriptOperators::IsObject(resolvedOptionsValue), BVar1 != 0)) {
      functionObj = VarTo<Js::DynamicObject>(resolvedOptionsValue);
      BVar1 = Js::JavascriptOperators::GetProperty
                        (&functionObj->super_RecyclableObject,0x210,&getter,
                         (ScriptContext *)intlObject_local,(PropertyValueInfo *)0x0);
      if ((BVar1 != 0) && (BVar1 = Js::JavascriptOperators::IsObject(getter), BVar1 != 0)) {
        propertyValue = VarTo<Js::DynamicObject>(getter);
        (*(((DynamicObject *)propertyValue)->super_RecyclableObject).super_FinalizableObject.
          super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3c])(propertyValue,0x124,1);
        (**(code **)(*propertyValue + 0x108))(propertyValue,0x124,0);
        BVar1 = Js::JavascriptOperators::GetOwnAccessors
                          (functionObj,(PropertyId)prototypeObject,&setter,&local_58,
                           (ScriptContext *)intlObject_local);
        if ((BVar1 != 0) && (BVar1 = Js::JavascriptOperators::IsObject(setter), BVar1 != 0)) {
          propertyValue = VarTo<Js::DynamicObject>(setter);
          (*(((DynamicObject *)propertyValue)->super_RecyclableObject).super_FinalizableObject.
            super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x3c])(propertyValue,0x124,1);
          (**(code **)(*propertyValue + 0x108))(propertyValue,0x124,0);
        }
      }
    }
  }
  return;
}

Assistant:

void IntlEngineInterfaceExtensionObject::deletePrototypePropertyHelper(ScriptContext* scriptContext, DynamicObject* intlObject, Js::PropertyId objectPropertyId, Js::PropertyId getterFunctionId)
    {
        DynamicObject *prototypeObject = nullptr;
        DynamicObject *functionObj = nullptr;
        Var propertyValue = nullptr;
        Var prototypeValue = nullptr;
        Var resolvedOptionsValue = nullptr;
        Var getter = nullptr;
        Var setter = nullptr;

        if (!JavascriptOperators::GetProperty(intlObject, objectPropertyId, &propertyValue, scriptContext) ||
            !JavascriptOperators::IsObject(propertyValue))
        {
            return;
        }

        if (!JavascriptOperators::GetProperty(VarTo<DynamicObject>(propertyValue), Js::PropertyIds::prototype, &prototypeValue, scriptContext) ||
            !JavascriptOperators::IsObject(prototypeValue))
        {
            return;
        }

        prototypeObject = VarTo<DynamicObject>(prototypeValue);

        if (!JavascriptOperators::GetProperty(prototypeObject, Js::PropertyIds::resolvedOptions, &resolvedOptionsValue, scriptContext) ||
            !JavascriptOperators::IsObject(resolvedOptionsValue))
        {
            return;
        }

        functionObj = VarTo<DynamicObject>(resolvedOptionsValue);
        functionObj->SetConfigurable(Js::PropertyIds::prototype, true);
        functionObj->DeleteProperty(Js::PropertyIds::prototype, Js::PropertyOperationFlags::PropertyOperation_None);

        if (!JavascriptOperators::GetOwnAccessors(prototypeObject, getterFunctionId, &getter, &setter, scriptContext) ||
            !JavascriptOperators::IsObject(getter))
        {
            return;
        }

        functionObj = VarTo<DynamicObject>(getter);
        functionObj->SetConfigurable(Js::PropertyIds::prototype, true);
        functionObj->DeleteProperty(Js::PropertyIds::prototype, Js::PropertyOperationFlags::PropertyOperation_None);
    }